

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  uint *puVar1;
  ZSTD_format_e format;
  ZSTD_ErrorCode ZVar2;
  size_t sVar3;
  ZSTD_DDict *pZVar4;
  ZSTD_DDict *__n;
  XXH64_hash_t XVar5;
  byte bVar6;
  int iVar7;
  ZSTD_DDict *__n_00;
  ZSTD_DDict *pZVar8;
  uint *puVar9;
  uint *puVar10;
  char cVar11;
  ZSTD_DDict *pZVar12;
  bool bVar13;
  BYTE *ostart;
  uint *local_b0;
  uint *local_a8;
  uint *local_88;
  blockProperties_t local_44;
  ZSTD_DDict *local_38;
  
  if (ddict != (ZSTD_DDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                  ,0x428,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ZSTD_DDict_dictContent(ddict);
    dictSize = ZSTD_DDict_dictSize(ddict);
  }
  bVar6 = 0;
  pZVar12 = ddict;
  local_a8 = (uint *)src;
  local_88 = (uint *)dst;
  do {
    if (ZSTD_f_zstd1_magicless < dctx->format) {
      __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0xeb,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
    }
    do {
      if (srcSize < (ZSTD_DDict *)((ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1)) {
        if ((ZSTD_DDict *)srcSize != (ZSTD_DDict *)0x0) {
          return 0xffffffffffffffb8;
        }
        return (long)local_88 - (long)dst;
      }
      pZVar8 = pZVar12;
      if (srcSize < (ZSTD_DDict *)0x4) goto LAB_0075ed56;
      iVar7 = 0;
      if ((*local_a8 & 0xfffffff0) == 0x184d2a50) {
        pZVar8 = (ZSTD_DDict *)0xffffffffffffffb8;
        if ((ZSTD_DDict *)0x7 < srcSize) {
          pZVar8 = (ZSTD_DDict *)0xfffffffffffffff2;
          if ((local_a8[1] >> 3 < 0x1fffffff) &&
             (pZVar8 = (ZSTD_DDict *)((ulong)local_a8[1] + 8), srcSize < pZVar8)) {
            pZVar8 = (ZSTD_DDict *)0xffffffffffffffb8;
          }
        }
        iVar7 = 1;
        if (pZVar8 < (ZSTD_DDict *)0xffffffffffffff89) {
          bVar13 = srcSize < pZVar8;
          srcSize = srcSize - (long)pZVar8;
          if (bVar13) {
            __assert_fail("skippableSize <= srcSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x44e,
                          "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                         );
          }
          local_a8 = (uint *)((long)local_a8 + (long)pZVar8);
          iVar7 = 2;
          pZVar8 = pZVar12;
        }
      }
      pZVar12 = pZVar8;
    } while (iVar7 == 2);
    if (iVar7 != 0) {
      return (size_t)pZVar8;
    }
LAB_0075ed56:
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar3 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    local_38 = pZVar8;
    ZSTD_checkContinuity(dctx,local_88,dstCapacity);
    format = dctx->format;
    if (srcSize < (ZSTD_DDict *)((ulong)(format == ZSTD_f_zstd1) * 4 + 5)) {
      pZVar12 = (ZSTD_DDict *)0xffffffffffffffb8;
    }
    else {
      pZVar4 = (ZSTD_DDict *)
               ZSTD_frameHeaderSize_internal
                         (local_a8,(ulong)(format == ZSTD_f_zstd1) * 4 + 1,format);
      puVar10 = local_a8;
      pZVar8 = (ZSTD_DDict *)srcSize;
      if (pZVar4 < (ZSTD_DDict *)0xffffffffffffff89) {
        if (srcSize < (ZSTD_DDict *)((long)&pZVar4->dictBuffer + 3U)) {
          bVar13 = false;
          pZVar12 = (ZSTD_DDict *)0xffffffffffffffb8;
        }
        else {
          pZVar12 = (ZSTD_DDict *)ZSTD_decodeFrameHeader(dctx,local_a8,(size_t)pZVar4);
          bVar13 = pZVar12 < (ZSTD_DDict *)0xffffffffffffff89;
          if (bVar13) {
            puVar10 = (uint *)((long)local_a8 + (long)pZVar4);
            pZVar8 = (ZSTD_DDict *)(srcSize - (long)pZVar4);
          }
        }
      }
      else {
        bVar13 = false;
        pZVar12 = pZVar4;
      }
      if (bVar13) {
        puVar1 = (uint *)((long)local_88 + dstCapacity);
        local_b0 = local_88;
        pZVar4 = pZVar12;
        do {
          __n = (ZSTD_DDict *)ZSTD_getcBlockSize(puVar10,(size_t)pZVar8,&local_44);
          cVar11 = '\x01';
          pZVar12 = __n;
          if (__n < (ZSTD_DDict *)0xffffffffffffff89) {
            puVar10 = (uint *)((long)puVar10 + 3);
            pZVar8 = (ZSTD_DDict *)((long)&pZVar8[-1].cMem.opaque + 5);
            if (pZVar8 < __n) {
              pZVar12 = (ZSTD_DDict *)0xffffffffffffffb8;
            }
            else {
              puVar9 = puVar1;
              if (puVar10 < puVar1) {
                puVar9 = puVar10;
              }
              if (puVar10 < local_b0) {
                puVar9 = puVar1;
              }
              if (local_44.blockType == bt_raw) {
                pZVar12 = (ZSTD_DDict *)0xffffffffffffffba;
                if (__n <= (ZSTD_DDict *)((long)puVar1 - (long)local_b0)) {
                  if (local_b0 == (uint *)0x0) {
                    pZVar12 = (ZSTD_DDict *)0xffffffffffffffb6;
                    if (__n == (ZSTD_DDict *)0x0) {
                      pZVar12 = __n;
                    }
                  }
                  else {
                    memmove(local_b0,puVar10,(size_t)__n);
                    pZVar12 = __n;
                  }
                }
              }
              else if (local_44.blockType == bt_rle) {
                __n_00 = (ZSTD_DDict *)(ulong)local_44.origSize;
                pZVar12 = (ZSTD_DDict *)0xffffffffffffffba;
                if (__n_00 <= (ZSTD_DDict *)((long)puVar9 - (long)local_b0)) {
                  pZVar12 = __n_00;
                  if (local_b0 == (uint *)0x0) {
                    if (__n_00 != (ZSTD_DDict *)0x0) {
                      pZVar12 = (ZSTD_DDict *)0xffffffffffffffb6;
                    }
                  }
                  else {
                    memset(local_b0,(uint)*(byte *)puVar10,(size_t)__n_00);
                  }
                }
              }
              else {
                if (local_44.blockType != bt_compressed) {
                  pZVar12 = (ZSTD_DDict *)0xffffffffffffffec;
                  goto LAB_0075eeb0;
                }
                pZVar12 = (ZSTD_DDict *)
                          ZSTD_decompressBlock_internal
                                    (dctx,local_b0,(long)puVar9 - (long)local_b0,puVar10,(size_t)__n
                                     ,1,not_streaming);
              }
              if (pZVar12 < (ZSTD_DDict *)0xffffffffffffff89) {
                if (dctx->validateChecksum != 0) {
                  ZSTD_XXH64_update(&dctx->xxhState,local_b0,(size_t)pZVar12);
                }
                local_b0 = (uint *)((long)local_b0 + (long)pZVar12);
                puVar10 = (uint *)((long)puVar10 + (long)__n);
                cVar11 = (local_44.lastBlock != 0) * '\x05';
                pZVar8 = (ZSTD_DDict *)((long)pZVar8 - (long)__n);
                pZVar12 = pZVar4;
              }
            }
          }
LAB_0075eeb0:
          pZVar4 = pZVar12;
        } while (cVar11 == '\0');
        if (cVar11 == '\x05') {
          pZVar4 = (ZSTD_DDict *)(dctx->fParams).frameContentSize;
          pZVar12 = (ZSTD_DDict *)((long)local_b0 - (long)local_88);
          if ((pZVar4 == (ZSTD_DDict *)0xffffffffffffffff) || (pZVar12 == pZVar4)) {
            if ((dctx->fParams).checksumFlag == 0) {
LAB_0075f0e3:
              srcSize = (size_t)pZVar8;
              ZSTD_DCtx_trace_end(dctx,(U64)pZVar12,(long)puVar10 - (long)local_a8,0);
              local_a8 = puVar10;
            }
            else if (pZVar8 < (ZSTD_DDict *)0x4) {
              pZVar12 = (ZSTD_DDict *)0xffffffffffffffea;
            }
            else {
              if ((dctx->forceIgnoreChecksum != ZSTD_d_validateChecksum) ||
                 (XVar5 = ZSTD_XXH64_digest(&dctx->xxhState), *puVar10 == (uint)XVar5)) {
                puVar10 = puVar10 + 1;
                pZVar8 = (ZSTD_DDict *)((long)&pZVar8[-1].cMem.opaque + 4);
                goto LAB_0075f0e3;
              }
              pZVar12 = (ZSTD_DDict *)0xffffffffffffffea;
            }
          }
          else {
            pZVar12 = (ZSTD_DDict *)0xffffffffffffffec;
          }
        }
      }
    }
    ZVar2 = ZSTD_getErrorCode((size_t)pZVar12);
    if ((bool)(bVar6 & ZVar2 == ZSTD_error_prefix_unknown)) {
      bVar13 = false;
      pZVar12 = (ZSTD_DDict *)0xffffffffffffffb8;
    }
    else if (pZVar12 < (ZSTD_DDict *)0xffffffffffffff89) {
      bVar13 = dstCapacity < pZVar12;
      dstCapacity = dstCapacity - (long)pZVar12;
      if (bVar13) {
        __assert_fail("res <= dstCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x46d,
                      "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                     );
      }
      local_88 = (uint *)((long)local_88 + (long)pZVar12);
      bVar13 = true;
      pZVar12 = local_38;
    }
    else {
      bVar13 = false;
    }
    bVar6 = 1;
    if (!bVar13) {
      return (size_t)pZVar12;
    }
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        if (srcSize >= 4) {
            U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(5, "reading magic number %08X", (unsigned)magicNumber);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                /* skippable frame detected : skip it */
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "invalid skippable frame");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue; /* check next frame */
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}